

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_MMDP_OnlineSolve.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  NullPlanner *this;
  basic_ostream<char,_std::char_traits<char>_> *this_00;
  matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  *this_01;
  undefined8 in_RSI;
  undefined4 in_EDI;
  double dVar2;
  E *e;
  double r;
  SimulationDecPOMDPDiscrete sim;
  int seed;
  int nrRuns;
  row_t row;
  QTable q;
  MDPValueIteration vi;
  PlanningUnitDecPOMDPDiscrete *np;
  DecPOMDPDiscreteInterface *decpomdp;
  Arguments args;
  undefined8 in_stack_fffffffffffffc20;
  Index s_i;
  QTable *in_stack_fffffffffffffc28;
  Arguments *in_stack_fffffffffffffc60;
  SimulationDecPOMDPDiscrete local_348 [84];
  undefined4 local_2f4;
  int local_2f0;
  int local_2ec;
  undefined1 local_2d8 [48];
  MDPValueIteration local_2a8 [64];
  NullPlanner *local_268;
  DecPOMDPDiscreteInterface *local_260;
  undefined1 local_248 [48];
  SimulationDecPOMDPDiscrete *in_stack_fffffffffffffde8;
  PlanningUnitDecPOMDPDiscrete *in_stack_fffffffffffffdf0;
  vector_expression<boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
  *in_stack_fffffffffffffe48;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffe50;
  
  s_i = (Index)((ulong)in_stack_fffffffffffffc20 >> 0x20);
  ArgumentHandlers::Arguments::Arguments(in_stack_fffffffffffffc60);
  argp_parse(ArgumentHandlers::theArgpStruc,in_EDI,in_RSI,0,0,local_248);
  poVar1 = std::operator<<((ostream *)&std::cout,"Instantiating the problem...");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  local_260 = (DecPOMDPDiscreteInterface *)
              ArgumentUtils::GetDecPOMDPDiscreteInterfaceFromArgs((Arguments *)local_248);
  poVar1 = std::operator<<((ostream *)&std::cout,"...done.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  this = (NullPlanner *)operator_new(0x338);
  NullPlanner::NullPlanner(this,999999,local_260,(PlanningUnitMADPDiscreteParameters *)0x0);
  local_268 = this;
  poVar1 = std::operator<<((ostream *)&std::cout,"Performing value iteration...");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  MDPValueIteration::MDPValueIteration(local_2a8,(PlanningUnitDecPOMDPDiscrete *)local_268);
  MDPValueIteration::Plan();
  poVar1 = std::operator<<((ostream *)&std::cout,"...done.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  MDPValueIteration::GetQTable((uint)local_2d8);
  QTable::GetRow(in_stack_fffffffffffffc28,s_i);
  local_2ec = (int)std::setprecision(7);
  poVar1 = std::operator<<((ostream *)&std::cout,(_Setprecision)local_2ec);
  std::operator<<(poVar1,"Here\'s first row (state 0) from VI result: \n");
  this_00 = boost::numeric::ublas::operator<<(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  std::ostream::operator<<((ostream *)this_00,std::endl<char,std::char_traits<char>>);
  local_2f0 = 500;
  local_2f4 = 0x2a;
  SimulationDecPOMDPDiscrete::SimulationDecPOMDPDiscrete
            (local_348,(PlanningUnitDecPOMDPDiscrete *)local_268,500,0x2a,false);
  dVar2 = runSimulations(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8);
  poVar1 = std::operator<<((ostream *)&std::cout,"Avg reward of ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_2f0);
  poVar1 = std::operator<<(poVar1," simulations: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,dVar2);
  this_01 = (matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
             *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<((ostream *)this_01,std::endl<char,std::char_traits<char>>);
  SimulationDecPOMDPDiscrete::~SimulationDecPOMDPDiscrete(local_348);
  boost::numeric::ublas::
  matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
  ::~matrix_row(this_01);
  QTable::~QTable((QTable *)this_01);
  MDPValueIteration::~MDPValueIteration(local_2a8);
  ArgumentHandlers::Arguments::~Arguments((Arguments *)0x107a12);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    ArgumentHandlers::Arguments args;
    argp_parse (&ArgumentHandlers::theArgpStruc, argc, argv, 0, 0, &args);

    try
    {
        cout << "Instantiating the problem..."<<endl;
        DecPOMDPDiscreteInterface* decpomdp = GetDecPOMDPDiscreteInterfaceFromArgs(args);
        cout << "...done."<<endl;

        // consider it an infinite-horizon problem by passing MAXHORIZON
        PlanningUnitDecPOMDPDiscrete *np = new NullPlanner(MAXHORIZON, decpomdp);

        ///---VI--------------------------------------------
        // only for reference, compute solution with value iteration
        cout << "Performing value iteration..."<<endl;
        MDPValueIteration vi(*np);
        vi.Plan();
        cout << "...done." <<endl;
        QTable q = vi.GetQTable(0); //<- infinite horizon, so get 1 value function of stage 0
        
        // output results of value iteration at a single state to allow
        // comparison with q learner results
        row_t row = q.GetRow(0);
        cout << setprecision(7)
             << "Here's first row (state 0) from VI result: \n" << row << endl;
        ///---end VI----------------------------------------------

        int nrRuns = 500;
        int seed = 42; //or: time(NULL)
        SimulationDecPOMDPDiscrete sim(*np, nrRuns, seed);

        double r;
        r = runSimulations(np, sim);
        cout << "Avg reward of "<< nrRuns << " simulations: " << r << endl << endl;

    }
    catch(E& e){ e.Print(); }

    return 0;
}